

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_xywh.cxx
# Opt level: O1

void screen_init(void)

{
  short sVar1;
  short sVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  Display *pDVar7;
  int iVar8;
  long lVar9;
  XRRScreenSize *pXVar10;
  int *piVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  short *psVar16;
  long lVar17;
  float fVar18;
  int nscreens;
  float local_2c;
  float local_28;
  int local_24;
  
  if (fl_display == (Display *)0x0) {
    fl_open_display();
  }
  if (screen_init::XRRSizes_f == (XRRSizes_type)0x0) {
    lVar9 = dlopen("libXrandr.so.2");
    if (lVar9 == 0) {
      lVar9 = dlopen("libXrandr.so");
    }
    if (lVar9 != 0) {
      screen_init::XRRSizes_f = (XRRSizes_type)dlsym(lVar9);
    }
  }
  if (screen_init::XRRSizes_f == (XRRSizes_type)0x0) {
    bVar5 = true;
    local_28 = 0.0;
    local_2c = 0.0;
  }
  else {
    pXVar10 = (*screen_init::XRRSizes_f)(fl_display,fl_screen,&local_24);
    bVar5 = local_24 < 1;
    if (local_24 < 1) {
      local_28 = 0.0;
      local_2c = 0.0;
    }
    else {
      local_28 = 0.0;
      local_2c = 0.0;
      if (pXVar10->mwidth != 0) {
        local_2c = ((float)pXVar10->width * 25.4) / (float)pXVar10->mwidth;
      }
      if (pXVar10->mheight != 0) {
        local_28 = ((float)pXVar10->height * 25.4) / (float)pXVar10->mheight;
      }
    }
  }
  iVar8 = XineramaIsActive(fl_display);
  if (iVar8 == 0) {
    uVar3 = *(uint *)(fl_display + 0xe4);
    num_screens = 0x10;
    if ((int)uVar3 < 0x10) {
      num_screens = uVar3;
    }
    if (0 < (int)uVar3) {
      lVar9 = *(long *)(fl_display + 0xe8);
      lVar12 = (long)fl_screen;
      uVar13 = (ulong)(uint)num_screens;
      piVar11 = (int *)(lVar9 + 0x20);
      uVar15 = 0;
      do {
        screens[uVar15].x_org = 0;
        screens[uVar15].y_org = 0;
        iVar8 = piVar11[-2];
        screens[uVar15].width = (short)iVar8;
        iVar6 = piVar11[-1];
        screens[uVar15].height = (short)iVar6;
        if (bVar5) {
          fVar18 = 0.0;
          if (*piVar11 != 0) {
            fVar18 = ((float)(int)(short)iVar8 * 25.4) / (float)*piVar11;
          }
          dpi[uVar15][0] = fVar18;
          iVar8 = *(int *)(lVar12 * 0x80 + lVar9 + 0x24);
          fVar18 = 0.0;
          if (iVar8 != 0) {
            fVar18 = ((float)(int)(short)iVar6 * 25.4) / (float)iVar8;
          }
        }
        else {
          dpi[uVar15][0] = local_2c;
          fVar18 = local_28;
        }
        dpi[uVar15][1] = fVar18;
        uVar15 = uVar15 + 1;
        piVar11 = piVar11 + 0x20;
      } while (uVar13 != uVar15);
    }
  }
  else {
    lVar9 = XineramaQueryScreens(fl_display,&num_screens);
    pDVar7 = fl_display;
    if (0x10 < num_screens) {
      num_screens = 0x10;
    }
    lVar12 = (long)num_screens;
    if (0 < lVar12) {
      lVar14 = (long)fl_screen;
      psVar16 = (short *)(lVar9 + 10);
      lVar17 = 0;
      do {
        screens[lVar17].x_org = psVar16[-3];
        screens[lVar17].y_org = psVar16[-2];
        sVar1 = psVar16[-1];
        screens[lVar17].width = sVar1;
        sVar2 = *psVar16;
        screens[lVar17].height = sVar2;
        if (bVar5) {
          lVar4 = *(long *)(pDVar7 + 0xe8);
          iVar8 = *(int *)(lVar4 + 0x20 + lVar14 * 0x80);
          fVar18 = 0.0;
          if (iVar8 != 0) {
            fVar18 = ((float)(int)sVar1 * 25.4) / (float)iVar8;
          }
          dpi[lVar17][0] = fVar18;
          iVar8 = *(int *)(lVar4 + 0x24 + lVar14 * 0x80);
          fVar18 = 0.0;
          if (iVar8 != 0) {
            fVar18 = ((float)(int)sVar2 * 25.4) / (float)iVar8;
          }
        }
        else {
          dpi[lVar17][0] = local_2c;
          fVar18 = local_28;
        }
        dpi[lVar17][1] = fVar18;
        lVar17 = lVar17 + 1;
        psVar16 = psVar16 + 6;
      } while (lVar12 != lVar17);
    }
    if (lVar9 != 0) {
      XFree(lVar9);
    }
  }
  return;
}

Assistant:

static void screen_init() {
  if (!fl_display) fl_open_display();

  int dpi_by_randr = 0;
  float dpih = 0.0f, dpiv = 0.0f;

#if USE_XRANDR

  static XRRSizes_type XRRSizes_f = NULL;
  if (!XRRSizes_f) {
    void *libxrandr_addr = dlopen("libXrandr.so.2", RTLD_LAZY);
    if (!libxrandr_addr) libxrandr_addr = dlopen("libXrandr.so", RTLD_LAZY);
#   ifdef __APPLE_CC__ // allows testing on Darwin + X11
    if (!libxrandr_addr) libxrandr_addr = dlopen("/opt/X11/lib/libXrandr.dylib", RTLD_LAZY);
#   endif
    if (libxrandr_addr) XRRSizes_f = (XRRSizes_type)dlsym(libxrandr_addr, "XRRSizes");
  }
  if (XRRSizes_f) {
    int nscreens;
    XRRScreenSize *ssize = XRRSizes_f(fl_display, fl_screen, &nscreens);

    //for (int i=0; i<nscreens; i++)
    //  printf("width=%d height=%d mwidth=%d mheight=%d\n",
    //         ssize[i].width,ssize[i].height,ssize[i].mwidth,ssize[i].mheight);

    if (nscreens > 0) { // Note: XRRSizes() *may* return nscreens == 0, see docs
      int mm = ssize[0].mwidth;
      dpih = mm ? ssize[0].width*25.4f/mm : 0.0f;
      mm = ssize[0].mheight;
      dpiv = mm ? ssize[0].height*25.4f/mm : 0.0f;
      dpi_by_randr = 1;
    }
  }

#endif // USE_XRANDR

#if HAVE_XINERAMA

  if (XineramaIsActive(fl_display)) {
    XineramaScreenInfo *xsi = XineramaQueryScreens(fl_display, &num_screens);
    if (num_screens > MAX_SCREENS) num_screens = MAX_SCREENS;

    /* There's no way to use different DPI for different Xinerama screens. */
    for (int i=0; i<num_screens; i++) {
      screens[i].x_org = xsi[i].x_org;
      screens[i].y_org = xsi[i].y_org;
      screens[i].width = xsi[i].width;
      screens[i].height = xsi[i].height;

      if (dpi_by_randr) {
	dpi[i][0] = dpih;
	dpi[i][1] = dpiv;
      } else {
        int mm = DisplayWidthMM(fl_display, fl_screen);
        dpi[i][0] = mm ? screens[i].width*25.4f/mm : 0.0f;
        mm = DisplayHeightMM(fl_display, fl_screen);
        dpi[i][1] = mm ? screens[i].height*25.4f/mm : 0.0f;
      }
    }
    if (xsi) XFree(xsi);
  } else

#endif // HAVE_XINERAMA

  { // ! HAVE_XINERAMA || ! XineramaIsActive()
    num_screens = ScreenCount(fl_display);
    if (num_screens > MAX_SCREENS) num_screens = MAX_SCREENS;

    for (int i=0; i<num_screens; i++) {
      screens[i].x_org = 0;
      screens[i].y_org = 0;
      screens[i].width = DisplayWidth(fl_display, i);
      screens[i].height = DisplayHeight(fl_display, i);

      if (dpi_by_randr) {
	dpi[i][0] = dpih;
	dpi[i][1] = dpiv;
      } else {
	int mm = DisplayWidthMM(fl_display, i);
	dpi[i][0] = mm ? screens[i].width*25.4f/mm : 0.0f;
	mm = DisplayHeightMM(fl_display, fl_screen);
	dpi[i][1] = mm ? screens[i].height*25.4f/mm : 0.0f;
      }
    }
  }
}